

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmCallm<(moira::Instr)142,(moira::Mode)9,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  u32 uVar2;
  StrWriter *pSVar3;
  Ea<(moira::Mode)9,_4> dst;
  Av<(moira::Instr)142,_(moira::Mode)9,_4> local_40;
  u32 local_3c;
  ushort local_38;
  u32 local_34;
  
  uVar2 = dasmIncRead<2>(this,addr);
  local_38 = op & 7;
  local_3c = *addr;
  local_34 = dasmIncRead<2>(this,addr);
  SVar1 = str->style->syntax;
  pSVar3 = StrWriter::operator<<(str);
  StrWriter::operator<<(pSVar3,(Tab)(str->tab).raw);
  if ((SVar1 & ~MOIRA_MIT) == GNU) {
    pSVar3 = StrWriter::operator<<(pSVar3,(Ims<1>)(uVar2 & 0xff));
    StrWriter::operator<<(pSVar3);
    StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)9,_4> *)&local_3c);
  }
  else {
    pSVar3 = StrWriter::operator<<(pSVar3,(Imu<4>)(uVar2 & 0xff));
    StrWriter::operator<<(pSVar3);
    StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)9,_4> *)&local_3c);
    local_40.ext1 = 0;
    StrWriter::operator<<(pSVar3,&local_40);
  }
  return;
}

Assistant:

void
Moira::dasmCallm(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead(addr) & 0xFF;
    auto dst = Op<M, S>( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<Byte>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu(src) << Sep{} << dst << Av<I, M, S>{};
    }
}